

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalBatchInsert::Finalize
          (PhysicalBatchInsert *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  GlobalSinkState *pGVar1;
  TableCatalogEntry *table;
  __pthread_internal_list *p_Var2;
  PhysicalIndex collection_index;
  pointer pPVar3;
  undefined8 uVar4;
  _Head_base<0UL,_duckdb::CollectionMerger_*,_false> _Var5;
  _Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false> _Var6;
  RowGroup *pRVar7;
  int iVar8;
  undefined4 extraout_var;
  RowGroupCollection *pRVar9;
  pointer __p;
  pointer pCVar10;
  OptimisticDataWriter *pOVar11;
  type pOVar12;
  InternalException *this_00;
  __pthread_internal_list *p_Var13;
  unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true> *merger;
  TableAppendState *this_01;
  undefined8 uVar14;
  unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
  current_merger;
  vector<duckdb::PhysicalIndex,_true> final_collections;
  templated_unique_single_t writer;
  LocalAppendState append_state;
  _Head_base<0UL,_duckdb::CollectionMerger_*,_false> local_1a0;
  _Any_data local_198;
  PhysicalIndex *local_188;
  code *pcStack_180;
  BatchMemoryManager *local_170;
  _Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false> local_168;
  GlobalSinkState *local_160;
  DuckTransaction *local_158;
  PhysicalIndex local_150;
  LocalAppendState local_148;
  DataTable *table_00;
  
  pGVar1 = input->global_state;
  table = (TableCatalogEntry *)
          pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align;
  iVar8 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar8);
  local_170 = (BatchMemoryManager *)(pGVar1 + 1);
  local_160 = pGVar1;
  if ((((ulong)pGVar1[4].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) &&
     (*(ulong *)((long)&pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                0x10) <
      *(ulong *)((long)&pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8
                ))) {
    TableAppendState::TableAppendState(&local_148.append_state);
    local_148.constraint_state.
    super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
    super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
    .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
         (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
          )0x0;
    DataTable::InitializeLocalAppend(table_00,&local_148,table,context,&this->bound_constraints);
    local_158 = DuckTransaction::Get
                          (context,(table->super_StandardEntry).super_InCatalogEntry.catalog);
    p_Var13 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
              .__prev;
    p_Var2 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
    if (p_Var13 != p_Var2) {
      do {
        if (*(char *)&p_Var13[2].__prev != '\x01') {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_198._M_unused._M_object = &local_188;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,"Encountered a flushed batch","");
          InternalException::InternalException(this_00,(string *)&local_198);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        BatchMemoryManager::ReduceUnflushedMemory(local_170,(idx_t)p_Var13[1].__prev);
        pRVar9 = DataTable::GetOptimisticCollection
                           (table_00,context,(PhysicalIndex)p_Var13[1].__next);
        local_188 = (PhysicalIndex *)0x0;
        pcStack_180 = (code *)0x0;
        local_198._M_unused._M_object = (void *)0x0;
        local_198._8_8_ = 0;
        local_198._M_unused._M_object = operator_new(0x18);
        *(DataTable **)local_198._M_unused._0_8_ = table_00;
        *(LocalAppendState **)((long)local_198._M_unused._0_8_ + 8) = &local_148;
        *(ClientContext **)((long)local_198._M_unused._0_8_ + 0x10) = context;
        pcStack_180 = ::std::
                      _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_batch_insert.cpp:669:32)>
                      ::_M_invoke;
        local_188 = (PhysicalIndex *)
                    ::std::
                    _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_batch_insert.cpp:669:32)>
                    ::_M_manager;
        RowGroupCollection::Scan
                  (pRVar9,local_158,(function<bool_(duckdb::DataChunk_&)> *)&local_198);
        if (local_188 != (PhysicalIndex *)0x0) {
          (*(code *)local_188)(&local_198,&local_198,3);
        }
        DataTable::ResetOptimisticCollection(table_00,context,(PhysicalIndex)p_Var13[1].__next);
        p_Var13 = (__pthread_internal_list *)&p_Var13[2].__next;
      } while (p_Var13 != p_Var2);
    }
    p_Var13 = local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
              __list.__prev;
    if (local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next != p_Var13) {
      local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
      __next = p_Var13;
    }
    DataTable::FinalizeLocalAppend(table_00,&local_148);
    BatchMemoryManager::FinalCheck(local_170);
    if (local_148.constraint_state.
        super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
        .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
         )0x0) {
      operator_delete((void *)local_148.constraint_state.
                              super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
                              .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl)
      ;
    }
    local_148.constraint_state.
    super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
    super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
    .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
         (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
          )0x0;
    TableAppendState::~TableAppendState(&local_148.append_state);
  }
  else {
    local_148.append_state.row_group_append_state.parent = (TableAppendState *)0x0;
    local_148.append_state.row_group_append_state.row_group = (RowGroup *)0x0;
    local_148.append_state.row_group_append_state.states.
    super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
    .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
         )(__uniq_ptr_data<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>,_true,_true>
           )0x0;
    local_1a0._M_head_impl = (CollectionMerger *)0x0;
    p_Var13 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
              .__prev;
    p_Var2 = pGVar1[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
    if (p_Var13 != p_Var2) {
      do {
        if (*(char *)&p_Var13[2].__prev == '\x01') {
          if (local_1a0._M_head_impl == (CollectionMerger *)0x0) {
            __p = (pointer)operator_new(0x30);
            __p->context = context;
            __p->data_table = table_00;
            (__p->collection_indexes).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (__p->collection_indexes).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__p->collection_indexes).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __p->batch_type = NOT_FLUSHED;
            ::std::
            __uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ::reset((__uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                     *)&local_1a0,__p);
          }
          pCVar10 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                    ::operator->((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                                  *)&local_1a0);
          CollectionMerger::AddCollection
                    (pCVar10,(PhysicalIndex)p_Var13[1].__next,
                     *(RowGroupBatchType *)&p_Var13[2].__prev);
          BatchMemoryManager::ReduceUnflushedMemory(local_170,(idx_t)p_Var13[1].__prev);
        }
        else {
          if (local_1a0._M_head_impl != (CollectionMerger *)0x0) {
            ::std::
            vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                        *)&local_148,
                       (unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                        *)&local_1a0);
            ::std::
            __uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
            ::reset((__uniq_ptr_impl<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>_>
                     *)&local_1a0,(pointer)0x0);
          }
          local_198._M_unused._M_object = operator_new(0x30);
          *(ClientContext **)local_198._M_unused._0_8_ = context;
          *(DataTable **)((long)local_198._M_unused._0_8_ + 8) = table_00;
          *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x10) = 0;
          *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x18) = 0;
          *(undefined8 *)((long)local_198._M_unused._0_8_ + 0x20) = 0;
          *(code *)((long)local_198._M_unused._0_8_ + 0x28) = (code)0x1;
          pCVar10 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                    ::operator->((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                                  *)&local_198);
          CollectionMerger::AddCollection
                    (pCVar10,(PhysicalIndex)p_Var13[1].__next,
                     *(RowGroupBatchType *)&p_Var13[2].__prev);
          ::std::
          vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                      *)&local_148,
                     (unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                      *)&local_198);
          uVar4 = local_198._M_unused._0_8_;
          if ((undefined8 *)local_198._M_unused._0_8_ != (undefined8 *)0x0) {
            if (*(void **)(local_198._M_unused._M_function_pointer + 0x10) != (void *)0x0) {
              operator_delete(*(void **)(local_198._M_unused._M_function_pointer + 0x10));
            }
            operator_delete((void *)uVar4);
          }
        }
        p_Var13 = (__pthread_internal_list *)&p_Var13[2].__next;
      } while (p_Var13 != p_Var2);
    }
    p_Var13 = local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
              __list.__prev;
    if (local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next != p_Var13) {
      local_160[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
      __next = p_Var13;
    }
    if (local_1a0._M_head_impl != (CollectionMerger *)0x0) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>
                ((vector<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>,std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,std::default_delete<duckdb::CollectionMerger>,true>>>
                  *)&local_148,
                 (unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                  *)&local_1a0);
    }
    local_198._M_unused._M_object = (PhysicalIndex *)0x0;
    local_198._8_8_ = (PhysicalIndex *)0x0;
    local_188 = (PhysicalIndex *)0x0;
    ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::reserve
              ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)&local_198,
               (long)local_148.append_state.row_group_append_state.row_group -
               (long)local_148.append_state.row_group_append_state.parent >> 3);
    pOVar11 = (OptimisticDataWriter *)operator_new(0x10);
    OptimisticDataWriter::OptimisticDataWriter(pOVar11,table_00);
    pRVar7 = local_148.append_state.row_group_append_state.row_group;
    uVar14 = local_198._M_unused._0_8_;
    local_168._M_head_impl = pOVar11;
    uVar4 = local_198._8_8_;
    if (local_148.append_state.row_group_append_state.parent !=
        (TableAppendState *)local_148.append_state.row_group_append_state.row_group) {
      this_01 = local_148.append_state.row_group_append_state.parent;
      do {
        pCVar10 = unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                  ::operator->((unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>
                                *)this_01);
        pOVar12 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                  ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                               *)&local_168);
        local_150 = CollectionMerger::Flush(pCVar10,pOVar12);
        if ((PhysicalIndex *)local_198._8_8_ == local_188) {
          ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
          _M_realloc_insert<duckdb::PhysicalIndex>
                    ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                     &local_198,(iterator)local_198._8_8_,&local_150);
        }
        else {
          *(idx_t *)local_198._8_8_ = local_150.index;
          local_198._8_8_ = local_198._8_8_ + 8;
        }
        this_01 = (TableAppendState *)&(this_01->row_group_append_state).row_group;
        uVar14 = local_198._M_unused._0_8_;
        uVar4 = local_198._8_8_;
      } while (this_01 != (TableAppendState *)pRVar7);
    }
    for (; uVar14 != uVar4; uVar14 = (PhysicalIndex *)(uVar14 + 8)) {
      collection_index.index = ((PhysicalIndex *)uVar14)->index;
      pRVar9 = DataTable::GetOptimisticCollection(table_00,context,collection_index);
      DataTable::LocalMerge(table_00,context,pRVar9);
      DataTable::ResetOptimisticCollection(table_00,context,collection_index);
    }
    pOVar11 = DataTable::GetOptimisticWriter(table_00,context);
    pOVar12 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
              ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                           *)&local_168);
    OptimisticDataWriter::Merge(pOVar11,pOVar12);
    OptimisticDataWriter::FinalFlush(pOVar11);
    BatchMemoryManager::FinalCheck(local_170);
    _Var6._M_head_impl = local_168._M_head_impl;
    if (local_168._M_head_impl != (OptimisticDataWriter *)0x0) {
      OptimisticDataWriter::~OptimisticDataWriter(local_168._M_head_impl);
      operator_delete(_Var6._M_head_impl);
    }
    if ((PhysicalIndex *)local_198._M_unused._0_8_ != (PhysicalIndex *)0x0) {
      operator_delete(local_198._M_unused._M_object);
    }
    _Var5._M_head_impl = local_1a0._M_head_impl;
    if (local_1a0._M_head_impl != (CollectionMerger *)0x0) {
      pPVar3 = ((local_1a0._M_head_impl)->collection_indexes).
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pPVar3 != (pointer)0x0) {
        operator_delete(pPVar3);
      }
      operator_delete(_Var5._M_head_impl);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CollectionMerger,_std::default_delete<duckdb::CollectionMerger>,_true>_>_>
               *)&local_148);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalBatchInsert::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                               OperatorSinkFinalizeInput &input) const {
	auto &g_state = input.global_state.Cast<BatchInsertGlobalState>();
	auto &table = g_state.table;
	auto &data_table = g_state.table.GetStorage();
	auto &memory_manager = g_state.memory_manager;

	if (g_state.optimistically_written || g_state.insert_count >= g_state.row_group_size) {
		// we have written data to disk optimistically or are inserting a large amount of data
		// perform a final pass over all of the row groups and merge them together
		vector<unique_ptr<CollectionMerger>> mergers;
		unique_ptr<CollectionMerger> current_merger;

		for (auto &entry : g_state.collections) {
			if (entry.type == RowGroupBatchType::NOT_FLUSHED) {
				// this collection has not been flushed: add it to the merge set
				if (!current_merger) {
					current_merger = make_uniq<CollectionMerger>(context, data_table);
				}
				current_merger->AddCollection(entry.collection_index, entry.type);
				memory_manager.ReduceUnflushedMemory(entry.unflushed_memory);
				continue;
			}

			// This collection has been flushed, so it does not need to be merged.
			// Create a separate collection merger for it.
			if (current_merger) {
				// Flush any remaining small allocations.
				mergers.push_back(std::move(current_merger));
				current_merger.reset();
			}
			auto larger_merger = make_uniq<CollectionMerger>(context, data_table);
			larger_merger->AddCollection(entry.collection_index, entry.type);
			mergers.push_back(std::move(larger_merger));
		}

		g_state.collections.clear();
		if (current_merger) {
			mergers.push_back(std::move(current_merger));
		}

		// now that we have created all of the mergers, perform the actual merging
		vector<PhysicalIndex> final_collections;
		final_collections.reserve(mergers.size());
		auto writer = make_uniq<OptimisticDataWriter>(data_table);
		for (auto &merger : mergers) {
			final_collections.push_back(merger->Flush(*writer));
		}

		// finally, merge the row groups into the local storage
		for (const auto collection_index : final_collections) {
			auto &collection = data_table.GetOptimisticCollection(context, collection_index);
			data_table.LocalMerge(context, collection);
			data_table.ResetOptimisticCollection(context, collection_index);
		}

		auto &optimistic_writer = data_table.GetOptimisticWriter(context);
		optimistic_writer.Merge(*writer);
		optimistic_writer.FinalFlush();
		memory_manager.FinalCheck();
		return SinkFinalizeType::READY;
	}

	// We are writing a small amount of data to disk.
	// Thus, we append directly to the transaction local storage.
	LocalAppendState append_state;
	data_table.InitializeLocalAppend(append_state, table, context, bound_constraints);
	auto &transaction = DuckTransaction::Get(context, table.catalog);
	for (auto &entry : g_state.collections) {
		if (entry.type != RowGroupBatchType::NOT_FLUSHED) {
			throw InternalException("Encountered a flushed batch");
		}

		memory_manager.ReduceUnflushedMemory(entry.unflushed_memory);
		auto &collection = data_table.GetOptimisticCollection(context, entry.collection_index);
		collection.Scan(transaction, [&](DataChunk &insert_chunk) {
			data_table.LocalAppend(append_state, context, insert_chunk, false);
			return true;
		});
		data_table.ResetOptimisticCollection(context, entry.collection_index);
	}

	g_state.collections.clear();
	data_table.FinalizeLocalAppend(append_state);
	memory_manager.FinalCheck();
	return SinkFinalizeType::READY;
}